

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall minibag::View::addQuery(View *this,Bag *bag,Time *start_time,Time *end_time)

{
  BagMode BVar1;
  BagQuery *this_00;
  runtime_error *this_01;
  function<bool_(const_minibag::ConnectionInfo_*)> query;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  _Manager_type local_58 [4];
  BagQuery *local_38;
  
  BVar1 = Bag::getMode(bag);
  if ((BVar1 & Read) != 0) {
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_70 = std::
               _Function_handler<bool_(const_minibag::ConnectionInfo_*),_minibag::View::TrueQuery>::
               _M_invoke;
    local_78 = std::
               _Function_handler<bool_(const_minibag::ConnectionInfo_*),_minibag::View::TrueQuery>::
               _M_manager;
    this_00 = (BagQuery *)operator_new(0x40);
    Query::Query((Query *)&local_68,(function<bool_(const_minibag::ConnectionInfo_*)> *)&local_88,
                 start_time,end_time);
    BagQuery::BagQuery(this_00,bag,(Query *)&local_68,bag->bag_revision_);
    local_38 = this_00;
    std::vector<minibag::BagQuery*,std::allocator<minibag::BagQuery*>>::
    emplace_back<minibag::BagQuery*>
              ((vector<minibag::BagQuery*,std::allocator<minibag::BagQuery*>> *)&this->queries_,
               &local_38);
    if (local_58[0] != (_Manager_type)0x0) {
      (*local_58[0])(&local_68,&local_68,__destroy_functor);
    }
    updateQueries(this,(this->queries_).
                       super__Vector_base<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_unused._M_object = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Bag not opened for reading","");
  std::runtime_error::runtime_error(this_01,(string *)local_68._M_pod_data);
  *(undefined ***)this_01 = &PTR__runtime_error_001506a0;
  __cxa_throw(this_01,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void View::addQuery(Bag const& bag, miniros::Time const& start_time, miniros::Time const& end_time) {
    if ((bag.getMode() & bagmode::Read) != bagmode::Read)
        throw BagException("Bag not opened for reading");

    std::function<bool(ConnectionInfo const*)> query = TrueQuery();

    queries_.push_back(new BagQuery(&bag, Query(query, start_time, end_time), bag.bag_revision_));

    updateQueries(queries_.back());
}